

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_sse2.c
# Opt level: O0

void subtract_average_sse2
               (uint16_t *src_ptr,int16_t *dst_ptr,int width,int height,int round_offset,
               int num_pel_log2)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  uint in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar4 [16];
  ulong uVar5;
  __m128i l0_00;
  __m128i *dst;
  __m128i avg_epi16;
  __m128i l1;
  __m128i l0;
  __m128i sum;
  int step;
  __m128i *end;
  __m128i *src;
  __m128i round_offset_epi32;
  __m128i zeros;
  undefined8 *local_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 *local_540;
  int local_388;
  int iStack_384;
  int iStack_380;
  int iStack_37c;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  
  local_540 = in_RDI;
  do {
    local_540 = local_540 + (long)(int)(((in_EDX == 8) + 1 + (uint)(in_EDX == 4) * 3) * 4) * 2;
  } while (local_540 < in_RDI + (long)(in_ECX << 2) * 2);
  l0_00[1] = (longlong)in_RSI;
  l0_00[0] = (longlong)in_RDI;
  fill_sum_epi32(l0_00);
  local_388 = (int)extraout_XMM0_Qa;
  iStack_384 = (int)((ulong)extraout_XMM0_Qa >> 0x20);
  iStack_380 = (int)extraout_XMM0_Qb;
  iStack_37c = (int)((ulong)extraout_XMM0_Qb >> 0x20);
  uVar5 = (ulong)in_R9D;
  local_598 = CONCAT44((uint)(iStack_384 + in_R8D) >> uVar5,(uint)(local_388 + in_R8D) >> uVar5);
  uStack_590._0_4_ = (uint)(iStack_380 + in_R8D) >> uVar5;
  uStack_590._4_4_ = (uint)(iStack_37c + in_R8D) >> uVar5;
  auVar3._8_8_ = uStack_590;
  auVar3._0_8_ = local_598;
  auVar4._8_8_ = uStack_590;
  auVar4._0_8_ = local_598;
  auVar4 = packssdw(auVar3,auVar4);
  local_5a0 = in_RSI;
  local_540 = in_RDI;
  do {
    local_c8 = auVar4._0_2_;
    sStack_c6 = auVar4._2_2_;
    sStack_c4 = auVar4._4_2_;
    sStack_c2 = auVar4._6_2_;
    if (in_EDX == 4) {
      uVar1 = *local_540;
      local_b8 = (short)uVar1;
      sStack_b6 = (short)((ulong)uVar1 >> 0x10);
      sStack_b4 = (short)((ulong)uVar1 >> 0x20);
      sStack_b2 = (short)((ulong)uVar1 >> 0x30);
      *local_5a0 = CONCAT26(sStack_b2 - sStack_c2,
                            CONCAT24(sStack_b4 - sStack_c4,
                                     CONCAT22(sStack_b6 - sStack_c6,local_b8 - local_c8)));
    }
    else {
      uVar1 = *local_540;
      uVar2 = local_540[1];
      local_d8 = (short)uVar1;
      sStack_d6 = (short)((ulong)uVar1 >> 0x10);
      sStack_d4 = (short)((ulong)uVar1 >> 0x20);
      sStack_d2 = (short)((ulong)uVar1 >> 0x30);
      sStack_d0 = (short)uVar2;
      sStack_ce = (short)((ulong)uVar2 >> 0x10);
      sStack_cc = (short)((ulong)uVar2 >> 0x20);
      sStack_ca = (short)((ulong)uVar2 >> 0x30);
      sStack_e0 = auVar4._8_2_;
      sStack_de = auVar4._10_2_;
      sStack_dc = auVar4._12_2_;
      sStack_da = auVar4._14_2_;
      *local_5a0 = CONCAT26(sStack_d2 - sStack_c2,
                            CONCAT24(sStack_d4 - sStack_c4,
                                     CONCAT22(sStack_d6 - sStack_c6,local_d8 - local_c8)));
      local_5a0[1] = CONCAT26(sStack_ca - sStack_da,
                              CONCAT24(sStack_cc - sStack_dc,
                                       CONCAT22(sStack_ce - sStack_de,sStack_d0 - sStack_e0)));
      if (8 < in_EDX) {
        uVar1 = local_540[2];
        uVar2 = local_540[3];
        local_f8 = (short)uVar1;
        sStack_f6 = (short)((ulong)uVar1 >> 0x10);
        sStack_f4 = (short)((ulong)uVar1 >> 0x20);
        sStack_f2 = (short)((ulong)uVar1 >> 0x30);
        sStack_f0 = (short)uVar2;
        sStack_ee = (short)((ulong)uVar2 >> 0x10);
        sStack_ec = (short)((ulong)uVar2 >> 0x20);
        sStack_ea = (short)((ulong)uVar2 >> 0x30);
        local_5a0[2] = CONCAT26(sStack_f2 - sStack_c2,
                                CONCAT24(sStack_f4 - sStack_c4,
                                         CONCAT22(sStack_f6 - sStack_c6,local_f8 - local_c8)));
        local_5a0[3] = CONCAT26(sStack_ea - sStack_da,
                                CONCAT24(sStack_ec - sStack_dc,
                                         CONCAT22(sStack_ee - sStack_de,sStack_f0 - sStack_e0)));
        if (in_EDX == 0x20) {
          uVar1 = local_540[4];
          uVar2 = local_540[5];
          local_118 = (short)uVar1;
          sStack_116 = (short)((ulong)uVar1 >> 0x10);
          sStack_114 = (short)((ulong)uVar1 >> 0x20);
          sStack_112 = (short)((ulong)uVar1 >> 0x30);
          sStack_110 = (short)uVar2;
          sStack_10e = (short)((ulong)uVar2 >> 0x10);
          sStack_10c = (short)((ulong)uVar2 >> 0x20);
          sStack_10a = (short)((ulong)uVar2 >> 0x30);
          local_5a0[4] = CONCAT26(sStack_112 - sStack_c2,
                                  CONCAT24(sStack_114 - sStack_c4,
                                           CONCAT22(sStack_116 - sStack_c6,local_118 - local_c8)));
          local_5a0[5] = CONCAT26(sStack_10a - sStack_da,
                                  CONCAT24(sStack_10c - sStack_dc,
                                           CONCAT22(sStack_10e - sStack_de,sStack_110 - sStack_e0)))
          ;
          uVar1 = local_540[6];
          uVar2 = local_540[7];
          local_138 = (short)uVar1;
          sStack_136 = (short)((ulong)uVar1 >> 0x10);
          sStack_134 = (short)((ulong)uVar1 >> 0x20);
          sStack_132 = (short)((ulong)uVar1 >> 0x30);
          sStack_130 = (short)uVar2;
          sStack_12e = (short)((ulong)uVar2 >> 0x10);
          sStack_12c = (short)((ulong)uVar2 >> 0x20);
          sStack_12a = (short)((ulong)uVar2 >> 0x30);
          local_5a0[6] = CONCAT26(sStack_132 - sStack_c2,
                                  CONCAT24(sStack_134 - sStack_c4,
                                           CONCAT22(sStack_136 - sStack_c6,local_138 - local_c8)));
          local_5a0[7] = CONCAT26(sStack_12a - sStack_da,
                                  CONCAT24(sStack_12c - sStack_dc,
                                           CONCAT22(sStack_12e - sStack_de,sStack_130 - sStack_e0)))
          ;
        }
      }
    }
    local_540 = local_540 + 8;
    local_5a0 = local_5a0 + 8;
  } while (local_540 < in_RDI + (long)(in_ECX << 2) * 2);
  return;
}

Assistant:

static inline void subtract_average_sse2(const uint16_t *src_ptr,
                                         int16_t *dst_ptr, int width,
                                         int height, int round_offset,
                                         int num_pel_log2) {
  const __m128i zeros = _mm_setzero_si128();
  const __m128i round_offset_epi32 = _mm_set1_epi32(round_offset);
  const __m128i *src = (__m128i *)src_ptr;
  const __m128i *const end = src + height * CFL_BUF_LINE_I128;
  const int step = CFL_BUF_LINE_I128 * (1 + (width == 8) + 3 * (width == 4));

  __m128i sum = zeros;
  do {
    __m128i l0;
    if (width == 4) {
      l0 = _mm_add_epi16(_mm_loadl_epi64(src),
                         _mm_loadl_epi64(src + CFL_BUF_LINE_I128));
      __m128i l1 = _mm_add_epi16(_mm_loadl_epi64(src + 2 * CFL_BUF_LINE_I128),
                                 _mm_loadl_epi64(src + 3 * CFL_BUF_LINE_I128));
      sum = _mm_add_epi32(sum, _mm_add_epi32(_mm_unpacklo_epi16(l0, zeros),
                                             _mm_unpacklo_epi16(l1, zeros)));
    } else {
      if (width == 8) {
        l0 = _mm_add_epi16(_mm_loadu_si128(src),
                           _mm_loadu_si128(src + CFL_BUF_LINE_I128));
      } else {
        l0 = _mm_add_epi16(_mm_loadu_si128(src), _mm_loadu_si128(src + 1));
      }
      sum = _mm_add_epi32(sum, _mm_add_epi32(_mm_unpacklo_epi16(l0, zeros),
                                             _mm_unpackhi_epi16(l0, zeros)));
      if (width == 32) {
        l0 = _mm_add_epi16(_mm_loadu_si128(src + 2), _mm_loadu_si128(src + 3));
        sum = _mm_add_epi32(sum, _mm_add_epi32(_mm_unpacklo_epi16(l0, zeros),
                                               _mm_unpackhi_epi16(l0, zeros)));
      }
    }
    src += step;
  } while (src < end);

  sum = fill_sum_epi32(sum);

  __m128i avg_epi16 =
      _mm_srli_epi32(_mm_add_epi32(sum, round_offset_epi32), num_pel_log2);
  avg_epi16 = _mm_packs_epi32(avg_epi16, avg_epi16);

  src = (__m128i *)src_ptr;
  __m128i *dst = (__m128i *)dst_ptr;
  do {
    if (width == 4) {
      _mm_storel_epi64(dst, _mm_sub_epi16(_mm_loadl_epi64(src), avg_epi16));
    } else {
      _mm_storeu_si128(dst, _mm_sub_epi16(_mm_loadu_si128(src), avg_epi16));
      if (width > 8) {
        _mm_storeu_si128(dst + 1,
                         _mm_sub_epi16(_mm_loadu_si128(src + 1), avg_epi16));
        if (width == 32) {
          _mm_storeu_si128(dst + 2,
                           _mm_sub_epi16(_mm_loadu_si128(src + 2), avg_epi16));
          _mm_storeu_si128(dst + 3,
                           _mm_sub_epi16(_mm_loadu_si128(src + 3), avg_epi16));
        }
      }
    }
    src += CFL_BUF_LINE_I128;
    dst += CFL_BUF_LINE_I128;
  } while (src < end);
}